

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

void SystemZ_init(MCRegisterInfo *MRI)

{
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffec;
  uint16_t *in_stack_fffffffffffffff8;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,SystemZRegDesc,0x62,0,0,SystemZMCRegisterClasses,0x3865a0,(uint16_t (*) [2])0x0,
             0x386700,(MCPhysReg *)CONCAT44(in_stack_ffffffffffffffec,7),(char *)0x0,
             in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void SystemZ_init(MCRegisterInfo *MRI)
{
	/*
	InitMCRegisterInfo(SystemZRegDesc, 98, RA, PC,
			SystemZMCRegisterClasses, 12,
			SystemZRegUnitRoots,
			49,
			SystemZRegDiffLists,
			SystemZRegStrings,
			SystemZSubRegIdxLists,
			7,
			SystemZSubRegIdxRanges,
			SystemZRegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, SystemZRegDesc, 98,
			0, 0,
			SystemZMCRegisterClasses, 12,
			0, 0,
			SystemZRegDiffLists,
			0,
			SystemZSubRegIdxLists, 7,
			0);
}